

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_section_fixups.cpp
# Opt level: O3

int InternalFixupSectionNames_SectionName_Test::AddToRegistry(void)

{
  pointer psVar1;
  UnitTest *this;
  ParameterizedTestSuiteRegistry *this_00;
  ParameterizedTestSuiteInfo<(anonymous_namespace)::InternalFixupSectionNames> *pPVar2;
  _Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_char_*,_pstore::repo::section_kind>_>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<const_char_*,_pstore::repo::section_kind>_>_>_>
  _Var3;
  element_type *peVar4;
  char *pcVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  ulong uVar7;
  pointer psVar8;
  ulong uVar9;
  pointer psVar10;
  CodeLocation *code_location;
  pointer psVar11;
  ulong uVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  long lVar13;
  size_type __dnew;
  long *local_100;
  long local_f8;
  long local_f0 [2];
  long *local_e0;
  long local_d8;
  long local_d0 [2];
  int local_c0;
  long *local_b8;
  long local_b0;
  long local_a8 [2];
  int local_98;
  long *local_90;
  long local_88;
  long local_80 [2];
  pointer local_70;
  ParameterizedTestSuiteInfo<(anonymous_namespace)::InternalFixupSectionNames> *local_68;
  long *local_60 [2];
  long local_50 [2];
  undefined4 local_40;
  _func_int *local_38;
  
  this = testing::UnitTest::GetInstance();
  this_00 = testing::UnitTest::parameterized_test_registry(this);
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,
             "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_section_fixups.cpp"
             ,"");
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char*>((string *)local_60,local_90,local_88 + (long)local_90);
  local_40 = 0xa9;
  pPVar2 = testing::internal::ParameterizedTestSuiteRegistry::
           GetTestSuitePatternHolder<(anonymous_namespace)::InternalFixupSectionNames>
                     (this_00,(char *)local_60,code_location);
  _Var3.
  super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_char_*,_pstore::repo::section_kind>_>_*,_false>
  ._M_head_impl =
       (_Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_char_*,_pstore::repo::section_kind>_>_*,_false>
        )operator_new(8);
  *(undefined ***)
   _Var3.
   super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_char_*,_pstore::repo::section_kind>_>_*,_false>
   ._M_head_impl = &PTR__TestMetaFactoryBase_00239568;
  local_100 = local_f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_100,
             "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_section_fixups.cpp"
             ,"");
  local_e0 = local_d0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e0,local_100,local_f8 + (long)local_100);
  local_c0 = 0xa9;
  peVar4 = (element_type *)operator_new(0x70);
  local_b8 = local_a8;
  std::__cxx11::string::_M_construct<char*>((string *)&local_b8,local_e0,local_d8 + (long)local_e0);
  local_98 = local_c0;
  (peVar4->test_suite_base_name)._M_dataplus._M_p = (pointer)&(peVar4->test_suite_base_name).field_2
  ;
  local_38 = (_func_int *)0x19;
  pcVar5 = (char *)std::__cxx11::string::_M_create((ulong *)peVar4,(ulong)&local_38);
  (peVar4->test_suite_base_name)._M_dataplus._M_p = pcVar5;
  (peVar4->test_suite_base_name).field_2._M_allocated_capacity = (size_type)local_38;
  builtin_strncpy(pcVar5,"InternalFixupSectionNames",0x19);
  (peVar4->test_suite_base_name)._M_string_length = (size_type)local_38;
  local_38[(long)(peVar4->test_suite_base_name)._M_dataplus._M_p] = (_func_int)0x0;
  (peVar4->test_base_name)._M_dataplus._M_p = (pointer)&(peVar4->test_base_name).field_2;
  (peVar4->test_base_name).field_2._M_allocated_capacity = 0x4e6e6f6974636553;
  *(undefined4 *)((long)&(peVar4->test_base_name).field_2 + 7) = 0x656d614e;
  (peVar4->test_base_name)._M_string_length = 0xb;
  (peVar4->test_base_name).field_2._M_local_buf[0xb] = '\0';
  (peVar4->test_meta_factory)._M_t.
  super___uniq_ptr_impl<testing::internal::TestMetaFactoryBase<std::tuple<const_char_*,_pstore::repo::section_kind>_>,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<const_char_*,_pstore::repo::section_kind>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_char_*,_pstore::repo::section_kind>_>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<const_char_*,_pstore::repo::section_kind>_>_>_>
  .
  super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_char_*,_pstore::repo::section_kind>_>_*,_false>
       = _Var3.
         super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_char_*,_pstore::repo::section_kind>_>_*,_false>
         ._M_head_impl;
  (peVar4->code_location).file._M_dataplus._M_p = (pointer)&(peVar4->code_location).file.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&peVar4->code_location,local_b8,local_b0 + (long)local_b8);
  (peVar4->code_location).line = local_98;
  p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  p_Var6->_M_use_count = 1;
  p_Var6->_M_weak_count = 1;
  p_Var6->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_base_00239378;
  p_Var6[1]._vptr__Sp_counted_base = (_func_int **)peVar4;
  psVar1 = (pPVar2->tests_).
           super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::InternalFixupSectionNames>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::InternalFixupSectionNames>::TestInfo>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar1 == (pPVar2->tests_).
                super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::InternalFixupSectionNames>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::InternalFixupSectionNames>::TestInfo>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_70 = (pPVar2->tests_).
               super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::InternalFixupSectionNames>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::InternalFixupSectionNames>::TestInfo>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    lVar13 = (long)psVar1 - (long)local_70;
    local_68 = pPVar2;
    if (lVar13 == 0x7ffffffffffffff0) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar7 = lVar13 >> 4;
    uVar9 = 1;
    if (psVar1 != local_70) {
      uVar9 = uVar7;
    }
    uVar12 = uVar9 + uVar7;
    if (0x7fffffffffffffe < uVar12) {
      uVar12 = 0x7ffffffffffffff;
    }
    if (CARRY8(uVar9,uVar7)) {
      uVar12 = 0x7ffffffffffffff;
    }
    psVar8 = (pointer)operator_new(uVar12 * 0x10);
    pPVar2 = local_68;
    *(element_type **)((long)psVar8 + lVar13) = peVar4;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)psVar8 + lVar13 + 8) = p_Var6;
    psVar11 = psVar8;
    for (psVar10 = local_70; psVar1 != psVar10; psVar10 = psVar10 + 1) {
      peVar4 = (psVar10->
               super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::InternalFixupSectionNames>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr;
      p_Var6 = (psVar10->
               super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::InternalFixupSectionNames>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
               )._M_refcount._M_pi;
      (psVar10->
      super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::InternalFixupSectionNames>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
      )._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (psVar11->
      super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::InternalFixupSectionNames>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
      )._M_ptr = peVar4;
      (psVar11->
      super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::InternalFixupSectionNames>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
      )._M_refcount._M_pi = p_Var6;
      (psVar10->
      super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::InternalFixupSectionNames>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
      )._M_ptr = (element_type *)0x0;
      psVar11 = psVar11 + 1;
    }
    if (local_70 != (pointer)0x0) {
      operator_delete(local_70,(long)(local_68->tests_).
                                     super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::InternalFixupSectionNames>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::InternalFixupSectionNames>::TestInfo>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)local_70);
    }
    (pPVar2->tests_).
    super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::InternalFixupSectionNames>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::InternalFixupSectionNames>::TestInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_start = psVar8;
    (pPVar2->tests_).
    super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::InternalFixupSectionNames>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::InternalFixupSectionNames>::TestInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = psVar11 + 1;
    (pPVar2->tests_).
    super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::InternalFixupSectionNames>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::InternalFixupSectionNames>::TestInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = psVar8 + uVar12;
  }
  else {
    (psVar1->
    super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::InternalFixupSectionNames>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
    )._M_ptr = peVar4;
    (psVar1->
    super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::InternalFixupSectionNames>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
    )._M_refcount._M_pi = p_Var6;
    (pPVar2->tests_).
    super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::InternalFixupSectionNames>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::InternalFixupSectionNames>::TestInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = psVar1 + 1;
  }
  if (local_b8 != local_a8) {
    operator_delete(local_b8,local_a8[0] + 1);
  }
  if (local_e0 != local_d0) {
    operator_delete(local_e0,local_d0[0] + 1);
  }
  if (local_100 != local_f0) {
    operator_delete(local_100,local_f0[0] + 1);
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] + 1);
  }
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  return 0;
}

Assistant:

TEST_P (InternalFixupSectionNames, SectionName) {
    auto const & ns = GetParam ();
    std::ostringstream os;
    os << R"({ "section" : ")" << std::get<pstore::gsl::czstring> (ns)
       << R"(", "type":17, "offset":19, "addend":-23 })";

    internal_fixup_collection fixups;
    auto const & parser = this->parse (os.str (), &fixups);
    ASSERT_FALSE (parser.has_error ()) << "JSON error was: " << parser.last_error ().message ();

    ASSERT_EQ (fixups.size (), 1U);
    EXPECT_EQ (fixups[0].section, std::get<pstore::repo::section_kind> (ns));
    EXPECT_EQ (fixups[0].type, 17U);
    EXPECT_EQ (fixups[0].offset, 19U);
    EXPECT_EQ (fixups[0].addend, -23);
}